

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O2

void __thiscall
bubbleJson::BubbleJson::StringifyArray
          (BubbleJson *this,BubbleValue *value,StringifyTypes stringifyType,int tabCount)

{
  char *pcVar1;
  BubbleValue *value_00;
  int i;
  int iVar2;
  
  ContextPushChar(this,'[');
  pcVar1 = (value->u).string.literal;
  value_00 = *(BubbleValue **)pcVar1;
  while( true ) {
    if (stringifyType == StringifyType_Beauty) {
      ContextPushChar(this,'\n');
      for (iVar2 = 0; iVar2 <= tabCount; iVar2 = iVar2 + 1) {
        ContextPushChar(this,'\t');
      }
    }
    StringifyValue(this,value_00,stringifyType,tabCount + 1);
    value_00 = value_00 + 1;
    if (value_00 == *(BubbleValue **)(pcVar1 + 8)) break;
    ContextPushChar(this,',');
  }
  if (stringifyType == StringifyType_Beauty) {
    ContextPushChar(this,'\n');
    iVar2 = 0;
    if (0 < tabCount) {
      iVar2 = tabCount;
    }
    while (iVar2 != 0) {
      ContextPushChar(this,'\t');
      iVar2 = iVar2 + -1;
    }
  }
  ContextPushChar(this,']');
  return;
}

Assistant:

void BubbleJson::StringifyArray(BubbleValue *value, StringifyTypes stringifyType, int tabCount)
{
    ContextPushChar('[');

    tabCount++;
    auto elements = value->u.array.elements;
    auto it = elements->begin();
    while (true)
    {
        if(stringifyType == StringifyType_Beauty)
        {
            ContextPushChar('\n');
            for (int i = 0; i < tabCount; ++i) { ContextPushChar('\t'); }
        }
        StringifyValue(&*it, stringifyType, tabCount);//weird
        it++;

        //reach the last one
        if(it == elements->end())
            break;
        else
            ContextPushChar(',');
    }

    tabCount--;
    if (stringifyType == StringifyType_Beauty)
    {
        ContextPushChar('\n');
        for (int i = 0; i < tabCount; ++i) { ContextPushChar('\t'); }
    }
    ContextPushChar(']');
}